

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorTables::FileDescriptorTables(FileDescriptorTables *this)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>
  local_36;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_35;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_34;
  allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
  local_33;
  equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_> local_32;
  PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_> local_31;
  allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
  local_30;
  equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_> local_2f;
  PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_> local_2e;
  allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
  local_2d;
  equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_> local_2c;
  PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_> local_2b;
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
  local_2a;
  PointerStringPairEqual local_29;
  PointerStringPairHash local_28;
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
  local_27;
  PointerStringPairEqual local_26;
  PointerStringPairHash local_25 [18];
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
  local_13;
  PointerStringPairEqual local_12;
  PointerStringPairHash local_11;
  FileDescriptorTables *local_10;
  FileDescriptorTables *this_local;
  
  local_10 = this;
  std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
  ::allocator(&local_13);
  hash_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
  ::hash_map(&this->symbols_by_parent_,3,&local_11,&local_12,&local_13);
  std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
  ::~allocator(&local_13);
  std::
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
  ::allocator(&local_27);
  hash_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::hash_map(&this->fields_by_lowercase_name_,3,local_25,&local_26,&local_27);
  std::
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
  ::~allocator(&local_27);
  std::
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
  ::allocator(&local_2a);
  hash_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::hash_map(&this->fields_by_camelcase_name_,3,&local_28,&local_29,&local_2a);
  std::
  allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
  ::~allocator(&local_2a);
  std::
  allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
  ::allocator(&local_2d);
  hash_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::hash_map(&this->fields_by_number_,3,&local_2b,&local_2c,&local_2d);
  std::
  allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
  ::~allocator(&local_2d);
  std::
  allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
  ::allocator(&local_30);
  hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::hash_map(&this->enum_values_by_number_,3,&local_2e,&local_2f,&local_30);
  std::
  allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
  ::~allocator(&local_30);
  std::
  allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
  ::allocator(&local_33);
  hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::hash_map(&this->unknown_enum_values_by_number_,3,&local_31,&local_32,&local_33);
  std::
  allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
  ::~allocator(&local_33);
  GoogleOnceDynamic::GoogleOnceDynamic(&this->locations_by_path_once_);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>
  ::allocator(&local_36);
  hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  ::hash_map(&this->locations_by_path_,0,&local_34,&local_35,&local_36);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>
  ::~allocator(&local_36);
  internal::Mutex::Mutex(&this->unknown_enum_values_mu_);
  return;
}

Assistant:

FileDescriptorTables::FileDescriptorTables()
    // Initialize all the hash tables to start out with a small # of buckets
    : symbols_by_parent_(3),
      fields_by_lowercase_name_(3),
      fields_by_camelcase_name_(3),
      fields_by_number_(3),
      enum_values_by_number_(3),
      unknown_enum_values_by_number_(3) {
}